

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intdiv.cpp
# Opt level: O0

void bitmanip::(anonymous_namespace)::
     test_intdiv_manual_norem<(bitmanip::Rounding)0,(bitmanip::Rounding)1>(void)

{
  test_intdiv_manual_norem_impl<signed_char,(bitmanip::Rounding)0,(bitmanip::Rounding)1>();
  test_intdiv_manual_norem_impl<unsigned_char,(bitmanip::Rounding)0,(bitmanip::Rounding)1>();
  test_intdiv_manual_norem_impl<int,(bitmanip::Rounding)0,(bitmanip::Rounding)1>();
  test_intdiv_manual_norem_impl<unsigned_int,(bitmanip::Rounding)0,(bitmanip::Rounding)1>();
  test_intdiv_manual_norem_impl<long_long,(bitmanip::Rounding)0,(bitmanip::Rounding)1>();
  test_intdiv_manual_norem_impl<unsigned_long_long,(bitmanip::Rounding)0,(bitmanip::Rounding)1>();
  return;
}

Assistant:

void test_intdiv_manual_norem()
{
    test_intdiv_manual_norem_impl<signed char, Round, TieBreak>();
    test_intdiv_manual_norem_impl<unsigned char, Round, TieBreak>();
    test_intdiv_manual_norem_impl<int, Round, TieBreak>();
    test_intdiv_manual_norem_impl<unsigned, Round, TieBreak>();
    test_intdiv_manual_norem_impl<long long, Round, TieBreak>();
    test_intdiv_manual_norem_impl<unsigned long long, Round, TieBreak>();
}